

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderLocatorBaseURI(xmlTextReaderLocatorPtr locator)

{
  long local_30;
  xmlParserInputPtr input;
  xmlChar *ret;
  xmlParserCtxtPtr ctx;
  xmlTextReaderLocatorPtr locator_local;
  
  if (locator == (xmlTextReaderLocatorPtr)0x0) {
    locator_local = (xmlTextReaderLocatorPtr)0x0;
  }
  else {
    if (*(long *)((long)locator + 0x50) == 0) {
      local_30 = *(long *)((long)locator + 0x38);
      if ((*(long *)(local_30 + 8) == 0) && (1 < *(int *)((long)locator + 0x40))) {
        local_30 = *(long *)(*(long *)((long)locator + 0x48) +
                            (long)(*(int *)((long)locator + 0x40) + -2) * 8);
      }
      if (local_30 == 0) {
        input = (xmlParserInputPtr)0x0;
      }
      else {
        input = (xmlParserInputPtr)xmlStrdup(*(xmlChar **)(local_30 + 8));
      }
    }
    else {
      input = (xmlParserInputPtr)xmlNodeGetBase((xmlDoc *)0x0,*(xmlNode **)((long)locator + 0x50));
    }
    locator_local = input;
  }
  return (xmlChar *)locator_local;
}

Assistant:

xmlChar *
xmlTextReaderLocatorBaseURI(xmlTextReaderLocatorPtr locator) {
    /* we know that locator is a xmlParserCtxtPtr */
    xmlParserCtxtPtr ctx = (xmlParserCtxtPtr)locator;
    xmlChar *ret = NULL;

    if (locator == NULL)
        return(NULL);
    if (ctx->node != NULL) {
	ret = xmlNodeGetBase(NULL,ctx->node);
    }
    else {
	/* inspired from error.c */
	xmlParserInputPtr input;
	input = ctx->input;
	if ((input->filename == NULL) && (ctx->inputNr > 1))
	    input = ctx->inputTab[ctx->inputNr - 2];
	if (input != NULL) {
	    ret = xmlStrdup(BAD_CAST input->filename);
	}
	else {
	    ret = NULL;
	}
    }

    return ret;
}